

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::printTrainingHelp(Args *this)

{
  ostream *poVar1;
  Args *this_00;
  ostream *poVar2;
  Args *in_RDI;
  char *pcVar3;
  loss_name ln;
  string local_58 [48];
  string local_28 [40];
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "\nThe following arguments for training are optional:\n");
  poVar1 = std::operator<<(poVar1,"  -lr                 learning rate [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->lr);
  pcVar3 = "]\n";
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,
                           "  -lrUpdateRate       change the rate of updates for the learning rate ["
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->lrUpdateRate);
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"  -dim                size of word vectors [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->dim);
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"  -ws                 size of the context window [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->ws);
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"  -epoch              number of epochs [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->epoch);
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"  -neg                number of negatives sampled [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->neg);
  poVar1 = std::operator<<(poVar1,pcVar3);
  ln = (loss_name)((ulong)pcVar3 >> 0x20);
  poVar1 = std::operator<<(poVar1,
                           "  -loss               loss function {ns, hs, softmax, one-vs-all} [");
  lossToString_abi_cxx11_(in_RDI,ln);
  poVar1 = std::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -thread             number of threads [");
  this_00 = (Args *)std::ostream::operator<<(poVar1,in_RDI->thread);
  poVar1 = std::operator<<((ostream *)this_00,"]\n");
  poVar2 = std::operator<<(poVar1,
                           "  -pretrainedVectors  pretrained word vectors for supervised learning ["
                          );
  poVar2 = std::operator<<(poVar2,(string *)&in_RDI->pretrainedVectors);
  poVar2 = std::operator<<(poVar2,"]\n");
  poVar2 = std::operator<<(poVar2,"  -saveOutput         whether output params should be saved [");
  boolToString_abi_cxx11_(this_00,SUB81((ulong)poVar1 >> 0x38,0));
  poVar1 = std::operator<<(poVar2,local_58);
  std::operator<<(poVar1,"]\n");
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Args::printTrainingHelp() {
  std::cerr
      << "\nThe following arguments for training are optional:\n"
      << "  -lr                 learning rate [" << lr << "]\n"
      << "  -lrUpdateRate       change the rate of updates for the learning rate ["
      << lrUpdateRate << "]\n"
      << "  -dim                size of word vectors [" << dim << "]\n"
      << "  -ws                 size of the context window [" << ws << "]\n"
      << "  -epoch              number of epochs [" << epoch << "]\n"
      << "  -neg                number of negatives sampled [" << neg << "]\n"
      << "  -loss               loss function {ns, hs, softmax, one-vs-all} ["
      << lossToString(loss) << "]\n"
      << "  -thread             number of threads [" << thread << "]\n"
      << "  -pretrainedVectors  pretrained word vectors for supervised learning ["
      << pretrainedVectors << "]\n"
      << "  -saveOutput         whether output params should be saved ["
      << boolToString(saveOutput) << "]\n";
}